

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

int VP8BitWriterInit(VP8BitWriter *bw,size_t expected_size)

{
  long in_RSI;
  undefined4 *in_RDI;
  size_t unaff_retaddr;
  int local_14;
  
  *in_RDI = 0xfe;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0xfffffff8;
  *(undefined8 *)(in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  in_RDI[10] = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  if (in_RSI == 0) {
    local_14 = 1;
  }
  else {
    local_14 = BitWriterResize((VP8BitWriter *)expected_size,unaff_retaddr);
  }
  return local_14;
}

Assistant:

int VP8BitWriterInit(VP8BitWriter* const bw, size_t expected_size) {
  bw->range_   = 255 - 1;
  bw->value_   = 0;
  bw->run_     = 0;
  bw->nb_bits_ = -8;
  bw->pos_     = 0;
  bw->max_pos_ = 0;
  bw->error_   = 0;
  bw->buf_     = NULL;
  return (expected_size > 0) ? BitWriterResize(bw, expected_size) : 1;
}